

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint * cimg_library::cimg::exception_mode(uint value,bool is_set)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,is_set) != 0) {
    mutex(0,1);
    exception_mode::mode = 4;
    if (value < 4) {
      exception_mode::mode = value;
    }
    mutex(0,0);
  }
  return &exception_mode::mode;
}

Assistant:

inline unsigned int& exception_mode(const unsigned int value, const bool is_set) {
      static unsigned int mode = cimg_verbosity;
      if (is_set) { cimg::mutex(0); mode = value<4?value:4; cimg::mutex(0,0); }
      return mode;
    }